

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDependenceAnalysisImpl.h
# Opt level: O3

void __thiscall
dg::dda::DataDependenceAnalysisImpl::~DataDependenceAnalysisImpl(DataDependenceAnalysisImpl *this)

{
  this->_vptr_DataDependenceAnalysisImpl = (_func_int **)&PTR__DataDependenceAnalysisImpl_0011ece8;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  ::_M_erase(&(this->options).functionModels._M_t,
             (_Link_type)
             (this->options).functionModels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&(this->options).super_AnalysisOptions.allocationFunctions._M_t,
             *(_Link_type *)
              ((long)&(this->options).super_AnalysisOptions.allocationFunctions._M_t._M_impl.
                      super__Rb_tree_header._M_header + 8));
  std::
  vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
  ::~vector(&(this->graph)._subgraphs);
  std::
  vector<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  ::~vector(&(this->graph)._nodes);
  return;
}

Assistant:

virtual ~DataDependenceAnalysisImpl() = default;